

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

sstack<dlib::sgd> __thiscall dlib::sstack<dlib::sgd>::pop(sstack<dlib::sgd> *this,size_t num)

{
  uint *puVar1;
  ostream *poVar2;
  fatal_error *this_00;
  sstack<dlib::sgd> sVar3;
  string local_1b0;
  ostringstream dlib_o_out;
  uint auStack_178 [88];
  
  sVar3.mysize = this->mysize - num;
  if (num <= this->mysize) {
    sVar3.data = this->data + num;
    return sVar3;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x239);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,"sstack<T> dlib::sstack<dlib::sgd>::pop(size_t) [T = dlib::sgd]");
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"num <= size()");
  std::operator<<(poVar2,".\n");
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar2 = std::operator<<((ostream *)&dlib_o_out,
                           "You can\'t pop more things from the stack than it has in it.");
  std::operator<<(poVar2,"\n");
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

sstack pop(size_t num=1) 
        { 
            DLIB_CASSERT(num <= size(), "You can't pop more things from the stack than it has in it.");
            return sstack(data+num, mysize-num);
        }